

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

bool matchit::impl::
     PatternTraits<matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>>>>
     ::
     matchPatternImpl<mathiu::impl::Product_const*,matchit::impl::Context<bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::Power_const*,bool,bool,mathiu::impl::Log_const*,bool,bool,mathiu::impl::Sin_const*,bool,bool,mathiu::impl::Arctan_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
               (Product **value,
               App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>
               *appPat,int32_t depth,
               Context<bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::Power_*,_bool,_bool,_const_mathiu::impl::Log_*,_bool,_bool,_const_mathiu::impl::Sin_*,_bool,_bool,_const_mathiu::impl::Arctan_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
               *context)

{
  bool bVar1;
  anon_class_1_0_00000001 *f;
  invoke_result_t<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_const_mathiu::impl::Product_*&>
  value_00;
  InternalPatternT<matchit::impl::Id<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess>_>_>
  *pattern;
  Context<bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::Power_*,_bool,_bool,_const_mathiu::impl::Log_*,_bool,_bool,_const_mathiu::impl::Sin_*,_bool,_bool,_const_mathiu::impl::Arctan_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
  *context_local;
  int32_t depth_local;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>
  *appPat_local;
  Product **value_local;
  
  f = App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>
      ::unary(appPat);
  value_00 = invoke_<matchit::impl::__1_const&,mathiu::impl::Product_const*&>(f,value);
  pattern = App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>
            ::pattern(appPat);
  bVar1 = matchPattern<mathiu::impl::Product_const&,matchit::impl::Id<std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>>,matchit::impl::Context<bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::Power_const*,bool,bool,mathiu::impl::Log_const*,bool,bool,mathiu::impl::Sin_const*,bool,bool,mathiu::impl::Arctan_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                    (value_00,pattern,depth + 1,context);
  return bVar1;
}

Assistant:

constexpr static auto matchPatternImpl(Value &&value,
                                                   App<Unary, Pattern> const &appPat,
                                                   int32_t depth, ContextT &context)
            {
                if constexpr (std::is_same_v<AppResultCurTuple<Value>, std::tuple<>>)
                {
                    return matchPattern(
                        std::forward<AppResult<Value>>(invoke_(appPat.unary(), value)),
                        appPat.pattern(), depth + 1, context);
                }
                else
                {
                    context.emplace_back(invoke_(appPat.unary(), value));
                    decltype(auto) result =
                        get<std::decay_t<AppResult<Value>>>(context.back());
                    return matchPattern(std::forward<AppResult<Value>>(result),
                                        appPat.pattern(), depth + 1, context);
                }
            }